

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void * ZSTD_cwksp_reserve_aligned(ZSTD_cwksp *ws,size_t bytes)

{
  ZSTD_cwksp_alloc_phase_e ZVar1;
  void *pvVar2;
  void *pvVar3;
  ulong uVar4;
  
  ZVar1 = ws->phase;
  if (ZSTD_cwksp_alloc_aligned < ZVar1) {
    __assert_fail("phase >= ws->phase",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x41e6,
                  "size_t ZSTD_cwksp_internal_advance_phase(ZSTD_cwksp *, ZSTD_cwksp_alloc_phase_e)"
                 );
  }
  if (ZVar1 == ZSTD_cwksp_alloc_aligned) {
LAB_00192852:
    uVar4 = bytes + 0x3f & 0xffffffffffffffc0;
    if (uVar4 != 0) {
      pvVar3 = (void *)((long)ws->allocStart - uVar4);
      pvVar2 = ws->tableEnd;
      ZSTD_cwksp_assert_internal_consistency(ws);
      if (pvVar3 < pvVar2) {
        __assert_fail("alloc >= bottom",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x41cf,
                      "void *ZSTD_cwksp_reserve_internal_buffer_space(ZSTD_cwksp *, const size_t)");
      }
      if (pvVar3 < ws->tableValidEnd) {
        ws->tableValidEnd = pvVar3;
      }
      ws->allocStart = pvVar3;
      goto LAB_00192887;
    }
  }
  else {
    if (ZVar1 != ZSTD_cwksp_alloc_objects) {
LAB_00192843:
      ws->phase = ZSTD_cwksp_alloc_aligned;
      ZSTD_cwksp_assert_internal_consistency(ws);
      goto LAB_00192852;
    }
    pvVar3 = ws->objectEnd;
    ws->tableValidEnd = pvVar3;
    ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
    uVar4 = (ulong)(-(int)pvVar3 & 0x3f);
    pvVar3 = (void *)((long)pvVar3 + uVar4);
    if (pvVar3 <= ws->workspaceEnd) {
      ws->objectEnd = pvVar3;
      ws->tableEnd = pvVar3;
      if (uVar4 != 0) {
        ws->tableValidEnd = pvVar3;
      }
      goto LAB_00192843;
    }
  }
  pvVar3 = (void *)0x0;
LAB_00192887:
  if (((ulong)pvVar3 & 0x3f) == 0) {
    return pvVar3;
  }
  __assert_fail("((size_t)ptr & (ZSTD_CWKSP_ALIGNMENT_BYTES-1))== 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x4259,"void *ZSTD_cwksp_reserve_aligned(ZSTD_cwksp *, size_t)");
}

Assistant:

MEM_STATIC size_t
ZSTD_cwksp_internal_advance_phase(ZSTD_cwksp* ws, ZSTD_cwksp_alloc_phase_e phase)
{
    assert(phase >= ws->phase);
    if (phase > ws->phase) {
        /* Going from allocating objects to allocating initOnce / tables */
        if (ws->phase < ZSTD_cwksp_alloc_aligned_init_once &&
            phase >= ZSTD_cwksp_alloc_aligned_init_once) {
            ws->tableValidEnd = ws->objectEnd;
            ws->initOnceStart = ZSTD_cwksp_initialAllocStart(ws);

            {   /* Align the start of the tables to 64 bytes. Use [0, 63] bytes */
                void *const alloc = ws->objectEnd;
                size_t const bytesToAlign = ZSTD_cwksp_bytes_to_align_ptr(alloc, ZSTD_CWKSP_ALIGNMENT_BYTES);
                void *const objectEnd = (BYTE *) alloc + bytesToAlign;
                DEBUGLOG(5, "reserving table alignment addtl space: %zu", bytesToAlign);
                RETURN_ERROR_IF(objectEnd > ws->workspaceEnd, memory_allocation,
                                "table phase - alignment initial allocation failed!");
                ws->objectEnd = objectEnd;
                ws->tableEnd = objectEnd;  /* table area starts being empty */
                if (ws->tableValidEnd < ws->tableEnd) {
                    ws->tableValidEnd = ws->tableEnd;
                }
            }
        }
        ws->phase = phase;
        ZSTD_cwksp_assert_internal_consistency(ws);
    }
    return 0;
}